

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O1

int zmaxheap_remove_index(zmaxheap_t *heap,int idx,void *p,float *v)

{
  long lVar1;
  int iVar2;
  float fVar3;
  int iVar4;
  size_t __n;
  int iVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  
  iVar5 = 0;
  if (idx < heap->size) {
    lVar7 = (long)idx;
    if (v != (float *)0x0) {
      *v = heap->values[lVar7];
    }
    if (p != (void *)0x0) {
      memcpy(p,heap->data + heap->el_sz * lVar7,heap->el_sz);
    }
    iVar4 = heap->size;
    lVar1 = (long)iVar4 + -1;
    iVar6 = (int)lVar1;
    heap->size = iVar6;
    iVar5 = 1;
    if (iVar6 != idx) {
      heap->values[lVar7] = heap->values[(long)iVar4 + -1];
      __n = heap->el_sz;
      memcpy(heap->data + __n * lVar7,heap->data + lVar1 * __n,__n);
      fVar3 = heap->values[lVar7];
      do {
        iVar4 = heap->size;
        if (iVar4 <= idx) {
          return 1;
        }
        iVar6 = idx * 2 + 1;
        fVar8 = -INFINITY;
        if (iVar6 < iVar4) {
          fVar8 = heap->values[iVar6];
        }
        iVar2 = idx * 2 + 2;
        fVar9 = -INFINITY;
        if (iVar2 < iVar4) {
          fVar9 = heap->values[iVar2];
        }
        if (fVar3 < fVar8 || fVar3 < fVar9) {
          if (fVar9 <= fVar8) {
            if (iVar4 <= iVar6) {
              __assert_fail("left < heap->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                            ,0xe5,"int zmaxheap_remove_index(zmaxheap_t *, int, void *, float *)");
            }
          }
          else {
            iVar6 = iVar2;
            if (iVar4 <= iVar2) {
              __assert_fail("right < heap->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                            ,0xea,"int zmaxheap_remove_index(zmaxheap_t *, int, void *, float *)");
            }
          }
          (*heap->swap)(heap,idx,iVar6);
          idx = iVar6;
        }
      } while (fVar3 < fVar8 || fVar3 < fVar9);
    }
  }
  return iVar5;
}

Assistant:

int zmaxheap_remove_index(zmaxheap_t *heap, int idx, void *p, float *v)
{
    if (idx >= heap->size)
        return 0;

    // copy out the requested element from the heap.
    if (v != NULL)
        *v = heap->values[idx];
    if (p != NULL)
        memcpy(p, &heap->data[idx*heap->el_sz], heap->el_sz);

    heap->size--;

    // If this element is already the last one, then there's nothing
    // for us to do.
    if (idx == heap->size)
        return 1;

    // copy last element to first element. (which probably upsets
    // the heap property).
    heap->values[idx] = heap->values[heap->size];
    memcpy(&heap->data[idx*heap->el_sz], &heap->data[heap->el_sz * heap->size], heap->el_sz);

    // now fix the heap. Note, as we descend, we're "pushing down"
    // the same node the entire time. Thus, while the index of the
    // parent might change, the parent_score doesn't.
    int parent = idx;
    float parent_score = heap->values[idx];

    // descend, fixing the heap.
    while (parent < heap->size) {

        int left = 2*parent + 1;
        int right = left + 1;

//            assert(parent_score == heap->values[parent]);

        float left_score = (left < heap->size) ? heap->values[left] : -INFINITY;
        float right_score = (right < heap->size) ? heap->values[right] : -INFINITY;

        // put the biggest of (parent, left, right) as the parent.

        // already okay?
        if (parent_score >= left_score && parent_score >= right_score)
            break;

        // if we got here, then one of the children is bigger than the parent.
        if (left_score >= right_score) {
            assert(left < heap->size);
            heap->swap(heap, parent, left);
            parent = left;
        } else {
            // right_score can't be less than left_score if right_score is -INFINITY.
            assert(right < heap->size);
            heap->swap(heap, parent, right);
            parent = right;
        }
    }

    return 1;
}